

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons1.c
# Opt level: O2

void * consumer(void *arg)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  anon_struct_64_4_491c87eb *paVar5;
  
  paVar5 = &shared;
  uVar4 = 0;
  while( true ) {
    uVar1 = (uVar4 & 0xffffffff) % 10;
    if (nitems <= (int)uVar4) break;
    iVar2 = sem_wait((sem_t *)shared.nstored);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4a);
      err_quit("Failed to wait for nstored");
    }
    iVar2 = sem_wait((sem_t *)shared.mutex);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4b);
      err_quit("Failed to wait for mutex");
    }
    lVar3 = (uVar4 / 10) * -0x28;
    printf("consuming %d at %d\n",uVar4 & 0xffffffff,uVar1);
    if ((int)uVar4 != *(int *)((long)paVar5 + lVar3)) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4e);
      err_sys("buff[%d] = %d, should be %d",uVar1,*(undefined4 *)((long)paVar5 + lVar3),
              uVar4 & 0xffffffff);
    }
    iVar2 = sem_post((sem_t *)shared.mutex);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4f);
      err_quit("Failed to post to mutex");
    }
    iVar2 = sem_post((sem_t *)shared.nempty);
    if (iVar2 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x50);
      err_quit("Failed to post to nempty");
    }
    uVar4 = uVar4 + 1;
    paVar5 = (anon_struct_64_4_491c87eb *)(paVar5->buff + 1);
  }
  return (void *)0x0;
}

Assistant:

void * consumer(void * arg) {
  int i;
  for (i = 0; i < nitems; ++i) {
    ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");
    ASSERT_ERR_QUIT(sem_wait(shared.mutex) == 0, "Failed to wait for mutex");
    printf("consuming %d at %d\n", i, i % NBUFF);
    ASSERT_ERR_SYS(shared.buff[i % NBUFF] == i, "buff[%d] = %d, should be %d",
      i % NBUFF, shared.buff[i % NBUFF], i);
    ASSERT_ERR_QUIT(sem_post(shared.mutex) == 0, "Failed to post to mutex");
    ASSERT_ERR_QUIT(sem_post(shared.nempty) == 0, "Failed to post to nempty");
  }

  return NULL;
}